

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdInitializeMultisigSign(void *handle,void **multisign_handle)

{
  CfdException *this;
  void *pvVar1;
  undefined8 *in_RSI;
  string *in_RDI;
  CfdException *except;
  exception *std_except;
  string *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  CfdError error_code;
  allocator *paVar2;
  allocator local_89;
  string local_88 [38];
  undefined1 local_62;
  allocator local_61;
  string local_60 [32];
  CfdSourceLocation local_40;
  
  error_code = (CfdError)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  cfd::Initialize();
  if (in_RSI == (undefined8 *)0x0) {
    local_40.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_40.filename = local_40.filename + 1;
    local_40.line = 0x761;
    local_40.funcname = "CfdInitializeMultisigSign";
    cfd::core::logger::warn<>(&local_40,"multisig sign handle is null.");
    local_62 = 1;
    this = (CfdException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_60,"Failed to parameter. multisig sign handle is null.",&local_61);
    cfd::core::CfdException::CfdException(this,error_code,in_stack_ffffffffffffff40);
    local_62 = 0;
    __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  paVar2 = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"MultisigSign",paVar2);
  pvVar1 = cfd::capi::AllocBuffer(in_RDI,(uint32_t)((ulong)in_RSI >> 0x20));
  *in_RSI = pvVar1;
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  return 0;
}

Assistant:

int CfdInitializeMultisigSign(void* handle, void** multisign_handle) {
  try {
    cfd::Initialize();
    if (multisign_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "multisig sign handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. multisig sign handle is null.");
    }

    *multisign_handle =
        AllocBuffer(kPrefixMultisigSignData, sizeof(CfdCapiMultisigSignData));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}